

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O0

vector<record,_std::allocator<record>_> * __thiscall
Tree::search(vector<record,_std::allocator<record>_> *__return_storage_ptr__,Tree *this,int key,
            Vertex *root)

{
  reference pvVar1;
  undefined1 local_40 [8];
  vector<record,_std::allocator<record>_> tempVector;
  Vertex *root_local;
  int key_local;
  Tree *this_local;
  
  tempVector.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)root;
  std::vector<record,_std::allocator<record>_>::vector
            ((vector<record,_std::allocator<record>_> *)local_40);
  if (tempVector.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage == (pointer)0x0) {
    std::vector<record,_std::allocator<record>_>::vector
              (__return_storage_ptr__,(vector<record,_std::allocator<record>_> *)local_40);
  }
  else {
    pvVar1 = std::vector<record,_std::allocator<record>_>::operator[]
                       ((vector<record,_std::allocator<record>_> *)
                        tempVector.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0);
    if (key < pvVar1->year) {
      search(__return_storage_ptr__,this,key,
             *(Vertex **)
              ((tempVector.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage)->title + 0x14));
    }
    else {
      pvVar1 = std::vector<record,_std::allocator<record>_>::operator[]
                         ((vector<record,_std::allocator<record>_> *)
                          tempVector.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
      if (pvVar1->year < key) {
        search(__return_storage_ptr__,this,key,
               *(Vertex **)
                ((tempVector.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage)->title + 0xc));
      }
      else {
        std::vector<record,_std::allocator<record>_>::vector
                  (__return_storage_ptr__,
                   (vector<record,_std::allocator<record>_> *)
                   tempVector.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
      }
    }
  }
  std::vector<record,_std::allocator<record>_>::~vector
            ((vector<record,_std::allocator<record>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

vector<record> search(int key, Vertex *root) {
        vector<record> tempVector;
        if (!root) return tempVector;
        if (key < root->data[0].year)
            return search(key, root->ptrLeft);
        else if (key > root->data[0].year)
            return search(key, root->ptrRight);
        return root->data;
    }